

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O1

void __thiscall
Fl_Text_Editor::remove_key_binding(Fl_Text_Editor *this,int key,int state,Key_Binding **list)

{
  Key_Binding *pKVar1;
  Key_Binding **ppKVar2;
  Key_Binding *pKVar3;
  
  if (*list != (Key_Binding *)0x0) {
    pKVar1 = (Key_Binding *)0x0;
    pKVar3 = *list;
    do {
      if ((pKVar3->key == key) && (pKVar3->state == state)) {
        ppKVar2 = &pKVar1->next;
        if (pKVar1 == (Key_Binding *)0x0) {
          ppKVar2 = list;
        }
        *ppKVar2 = pKVar3->next;
        operator_delete(pKVar3,0x18);
        return;
      }
      ppKVar2 = &pKVar3->next;
      pKVar1 = pKVar3;
      pKVar3 = *ppKVar2;
    } while (*ppKVar2 != (Key_Binding *)0x0);
  }
  return;
}

Assistant:

void Fl_Text_Editor::remove_key_binding(int key, int state, Key_Binding** list) {
  Key_Binding *cur, *last = 0;
  for (cur = *list; cur; last = cur, cur = cur->next)
    if (cur->key == key && cur->state == state) break;
  if (!cur) return;
  if (last) last->next = cur->next;
  else *list = cur->next;
  delete cur;
}